

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O3

int dobindkey(KEYMAP *map,char *func,char *str)

{
  byte bVar1;
  buffer *pbVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  undefined8 in_RCX;
  ulong uVar6;
  undefined6 uVar7;
  KCHAR *keys;
  KCHAR *pKVar8;
  bool bVar9;
  
  pbVar2 = curbp;
  uVar6 = CONCAT71((int7)((ulong)in_RCX >> 8),*str);
  iVar3 = (int)uVar6;
  if (*str == '\0') {
    keys = (KCHAR *)0x0;
  }
  else {
    pKVar8 = (KCHAR *)0x0;
    do {
      if ((char)uVar6 == '\\') {
        pcVar5 = str + 1;
        bVar1 = str[1];
        uVar7 = (undefined6)(uVar6 >> 0x10);
        if (bVar1 < 0x5c) {
          if (bVar1 < 0x4e) {
            if (bVar1 == 0) goto LAB_0010dd3a;
            if (bVar1 != 0x45) goto LAB_0010dd65;
LAB_0010dd34:
            uVar6 = CONCAT62((int6)(uVar6 >> 0x10),0x1b);
          }
          else if (bVar1 == 0x4e) {
LAB_0010dd45:
            uVar6 = (ulong)(uint)(int)*pbVar2->b_nlchr;
          }
          else if (bVar1 == 0x52) {
LAB_0010dd3f:
            uVar6 = CONCAT62(uVar7,0xd);
          }
          else {
            if (bVar1 != 0x54) goto LAB_0010dd65;
LAB_0010dd25:
            uVar6 = CONCAT62(uVar7,9);
          }
          goto LAB_0010dd5c;
        }
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x5c) {
            uVar6 = CONCAT62(uVar7,0x5c);
          }
          else {
            uVar6 = CONCAT62(uVar7,0x5e);
            if (bVar1 != 0x5e) {
              if (bVar1 == 0x65) goto LAB_0010dd34;
              goto LAB_0010dd65;
            }
          }
          goto LAB_0010dd5c;
        }
        if (bVar1 == 0x6e) goto LAB_0010dd45;
        if (bVar1 == 0x72) goto LAB_0010dd3f;
        if (bVar1 == 0x74) goto LAB_0010dd25;
      }
      else {
        if ((((uint)uVar6 & 0xff) == 0x5e) && (bVar1 = str[1], (ulong)bVar1 != 0)) {
          pp_Var4 = __ctype_toupper_loc();
          uVar6 = (ulong)((*pp_Var4)[bVar1] ^ 0x40);
          pcVar5 = str + 1;
        }
        else {
LAB_0010dd3a:
          uVar6 = (ulong)(uint)(int)(char)uVar6;
          pcVar5 = str;
        }
LAB_0010dd5c:
        key.k_chars[(long)pKVar8] = (KCHAR)uVar6;
      }
LAB_0010dd65:
      keys = (KCHAR *)((long)pKVar8 + 1);
      uVar6 = CONCAT71((int7)(uVar6 >> 8),pcVar5[1]);
      iVar3 = (int)uVar6;
    } while ((pcVar5[1] != '\0') &&
            (str = pcVar5 + 1, bVar9 = pKVar8 < (KCHAR *)0x7, pKVar8 = keys, bVar9));
  }
  key.k_count = (int)keys;
  iVar3 = bindkey((KEYMAP **)map,func,keys,iVar3);
  return iVar3;
}

Assistant:

int
dobindkey(KEYMAP *map, const char *func, const char *str)
{
	int	 i;

	for (i = 0; *str && i < MAXKEY; i++) {
		/* XXX - convert numbers w/ strol()? */
		if (*str == '^' && *(str + 1) !=  '\0') {
			key.k_chars[i] = CCHR(toupper((unsigned char)*++str));
		} else if (*str == '\\' && *(str + 1) != '\0') {
			switch (*++str) {
			case '^':
				key.k_chars[i] = '^';
				break;
			case 't':
			case 'T':
				key.k_chars[i] = '\t';
				break;
			case 'n':
			case 'N':
				key.k_chars[i] = *curbp->b_nlchr;
				break;
			case 'r':
			case 'R':
				key.k_chars[i] = '\r';
				break;
			case 'e':
			case 'E':
				key.k_chars[i] = CCHR('[');
				break;
			case '\\':
				key.k_chars[i] = '\\';
				break;
			}
		} else
			key.k_chars[i] = *str;
		str++;
	}
	key.k_count = i;
	return (bindkey(&map, func, key.k_chars, key.k_count));
}